

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall
dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
          (DGLLVMPointerAnalysis *this,Module *m,LLVMPointerAnalysisOptions *opts)

{
  LLVMPointerGraphBuilder *in_RDX;
  Module *in_RDI;
  pointer in_stack_ffffffffffffff48;
  LLVMPointerGraphBuilder *this_00;
  
  this_00 = in_RDX;
  LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
            ((LLVMPointerAnalysisOptions *)in_RDX,
             (LLVMPointerAnalysisOptions *)in_stack_ffffffffffffff48);
  LLVMPointerAnalysis::LLVMPointerAnalysis
            ((LLVMPointerAnalysis *)in_RDX,(LLVMPointerAnalysisOptions *)in_stack_ffffffffffffff48);
  LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions((LLVMPointerAnalysisOptions *)in_RDX);
  *(undefined ***)in_RDI = &PTR_hasPointsTo_001fd588;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  std::unique_ptr<dg::pta::PointerAnalysis,std::default_delete<dg::pta::PointerAnalysis>>::
  unique_ptr<std::default_delete<dg::pta::PointerAnalysis>,void>
            ((unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_> *
             )in_RDX);
  operator_new(0x228);
  pta::LLVMPointerGraphBuilder::LLVMPointerGraphBuilder
            (this_00,in_RDI,(LLVMPointerAnalysisOptions *)in_RDX);
  std::
  unique_ptr<dg::pta::LLVMPointerGraphBuilder,std::default_delete<dg::pta::LLVMPointerGraphBuilder>>
  ::unique_ptr<std::default_delete<dg::pta::LLVMPointerGraphBuilder>,void>
            ((unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
              *)in_RDX,in_stack_ffffffffffffff48);
  return;
}

Assistant:

DGLLVMPointerAnalysis(const llvm::Module *m,
                          const LLVMPointerAnalysisOptions opts)
            : LLVMPointerAnalysis(opts),
              _builder(new LLVMPointerGraphBuilder(m, opts)) {}